

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndChild(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *window;
  float fVar3;
  ImVec2 sz;
  ImRect bb;
  ImVec2 local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ImRect local_38;
  ImRect local_28;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if ((pIVar1->Flags & 0x1000000) == 0) {
    __assert_fail("window->Flags & ImGuiWindowFlags_ChildWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0x143e,"void ImGui::EndChild()");
  }
  if (1 < pIVar1->BeginCount) {
    End();
    return;
  }
  local_50 = pIVar1->Size;
  fVar3 = local_50.x;
  fStack_44 = local_50.y;
  local_48 = fVar3;
  fStack_40 = fStack_44;
  if ((pIVar1->AutoFitChildAxises & 1U) != 0) {
    local_48 = 4.0;
    if (4.0 <= fVar3) {
      local_48 = fVar3;
    }
    local_50.y = fStack_44;
    local_50.x = local_48;
    fStack_40 = 0.0;
  }
  fStack_3c = fStack_44;
  if ((pIVar1->AutoFitChildAxises & 2U) != 0) {
    fVar3 = 4.0;
    if (4.0 <= fStack_44) {
      fVar3 = fStack_44;
    }
    fStack_44 = fVar3;
    local_50.y = fStack_44;
    fStack_3c = 0.0;
  }
  End();
  local_38.Min.x = (pIVar2->CurrentWindow->DC).CursorPos.x;
  local_38.Min.y = (pIVar2->CurrentWindow->DC).CursorPos.y;
  fStack_40 = local_48 + local_38.Min.x;
  fStack_3c = fStack_44 + local_38.Min.y;
  local_48 = local_38.Min.x;
  fStack_44 = local_38.Min.y;
  local_38.Max.x = fStack_40;
  local_38.Max.y = fStack_3c;
  ItemSize(&local_50,0.0);
  if ((((pIVar1->DC).NavLayerActiveMask == 0) && ((pIVar1->DC).NavHasScroll != true)) ||
     ((pIVar1->Flags & 0x800000) != 0)) {
    ItemAdd(&local_38,0,(ImRect *)0x0);
  }
  else {
    ItemAdd(&local_38,pIVar1->ChildId,(ImRect *)0x0);
    RenderNavHighlight(&local_38,pIVar1->ChildId,1);
    if (((pIVar1->DC).NavLayerActiveMask == 0) && (pIVar1 == pIVar2->NavWindow)) {
      local_28.Min.x = local_48 + -2.0;
      local_28.Min.y = fStack_44 + -2.0;
      local_28.Max.x = fStack_40 + 2.0;
      local_28.Max.y = fStack_3c + 2.0;
      RenderNavHighlight(&local_28,pIVar2->NavId,2);
    }
  }
  return;
}

Assistant:

void ImGui::EndChild()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    IM_ASSERT(window->Flags & ImGuiWindowFlags_ChildWindow);   // Mismatched BeginChild()/EndChild() callss
    if (window->BeginCount > 1)
    {
        End();
    }
    else
    {
        // When using auto-filling child window, we don't provide full width/height to ItemSize so that it doesn't feed back into automatic size-fitting.
        ImVec2 sz = GetWindowSize();
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_X)) // Arbitrary minimum zero-ish child size of 4.0f causes less trouble than a 0.0f
            sz.x = ImMax(4.0f, sz.x);
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_Y))
            sz.y = ImMax(4.0f, sz.y);
        End();

        ImGuiWindow* parent_window = g.CurrentWindow;
        ImRect bb(parent_window->DC.CursorPos, parent_window->DC.CursorPos + sz);
        ItemSize(sz);
        if ((window->DC.NavLayerActiveMask != 0 || window->DC.NavHasScroll) && !(window->Flags & ImGuiWindowFlags_NavFlattened))
        {
            ItemAdd(bb, window->ChildId);
            RenderNavHighlight(bb, window->ChildId);

            // When browsing a window that has no activable items (scroll only) we keep a highlight on the child
            if (window->DC.NavLayerActiveMask == 0 && window == g.NavWindow)
                RenderNavHighlight(ImRect(bb.Min - ImVec2(2,2), bb.Max + ImVec2(2,2)), g.NavId, ImGuiNavHighlightFlags_TypeThin);
        }
        else
        {
            // Not navigable into
            ItemAdd(bb, 0);
        }
    }
}